

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O2

void __thiscall
icu_63::Normalizer2Impl::recompose
          (Normalizer2Impl *this,ReorderingBuffer *buffer,int32_t recomposeStartIndex,
          UBool onlyContiguous)

{
  UChar UVar1;
  ushort norm16;
  bool bVar2;
  uint16_t uVar3;
  int iVar4;
  uint uVar5;
  UChar *pUVar6;
  uint16_t *puVar7;
  ushort uVar8;
  UChar *pUVar9;
  UChar *pUVar10;
  UChar *pUVar11;
  UChar *pUVar12;
  uint c;
  UCPTrie *trie;
  ushort *puVar13;
  ushort uVar14;
  uint16_t *list;
  uint c_00;
  UChar *pUVar15;
  
  pUVar12 = buffer->start + recomposeStartIndex;
  pUVar15 = buffer->limit;
  if (pUVar12 == pUVar15) {
    return;
  }
  puVar7 = (uint16_t *)0x0;
  uVar8 = 0;
  bVar2 = false;
  puVar13 = (ushort *)0x0;
  do {
    list = puVar7;
    pUVar6 = pUVar12;
LAB_0028e749:
    do {
      uVar14 = uVar8;
      pUVar12 = pUVar6 + 1;
      UVar1 = *pUVar6;
      c_00 = (uint)(ushort)UVar1;
      if ((c_00 & 0xf800) == 0xd800) {
        if ((((ushort)UVar1 >> 10 & 1) == 0) && (pUVar12 != pUVar15)) {
          UVar1 = *pUVar12;
          trie = this->normTrie;
          if (((ushort)UVar1 & 0xfc00) == 0xdc00) {
            pUVar12 = pUVar6 + 2;
            c_00 = c_00 * 0x400 + (uint)(ushort)UVar1 + 0xfca02400;
            if ((int)c_00 < trie->highStart) {
              iVar4 = ucptrie_internalSmallIndex_63(trie,c_00);
              trie = this->normTrie;
            }
            else {
              iVar4 = trie->dataLength + -2;
            }
            goto LAB_0028e7ec;
          }
        }
        else {
          trie = this->normTrie;
        }
        iVar4 = trie->dataLength + -1;
      }
      else {
        trie = this->normTrie;
        iVar4 = (c_00 & 0x3f) + (uint)trie->index[(ushort)UVar1 >> 6];
      }
LAB_0028e7ec:
      norm16 = *(ushort *)((long)(trie->data).ptr0 + (long)iVar4 * 2);
      uVar8 = norm16 >> 1;
      if (norm16 < 0xfc00) {
        uVar8 = 0;
      }
      pUVar9 = pUVar15;
      pUVar6 = pUVar12;
      if ((((norm16 < 0xfe01) && (this->minMaybeYes <= norm16)) && (list != (uint16_t *)0x0)) &&
         ((byte)uVar14 == 0 || (byte)uVar14 < (byte)uVar8)) {
        if (norm16 == 0xfe00) {
          if ((c_00 < 0x11a7) && ((ushort)(*puVar13 + 0xef00) < 0x13)) {
            uVar8 = ((short)c_00 + (*puVar13 + 0xef00) * 0x15) * 0x1c + 0xc564;
            if ((pUVar12 != pUVar15) && ((ushort)(*pUVar12 + L'\xee59') < 0x1c)) {
              uVar8 = *pUVar12 + L'\xee59' + uVar8;
              pUVar6 = pUVar12 + 1;
            }
            pUVar12 = pUVar12 + -1;
            *puVar13 = uVar8;
            pUVar9 = pUVar12;
            for (; pUVar6 < pUVar15; pUVar6 = pUVar6 + 1) {
              *pUVar9 = *pUVar6;
              pUVar9 = pUVar9 + 1;
            }
          }
          list = (uint16_t *)0x0;
          pUVar15 = pUVar9;
          pUVar6 = pUVar12;
          uVar8 = uVar14;
          if (pUVar12 == pUVar9) goto LAB_0028eab1;
          goto LAB_0028e749;
        }
        uVar5 = combine(list,c_00);
        if (-1 < (int)uVar5) {
          c = uVar5 >> 1;
          pUVar10 = (UChar *)(((ulong)((uint)(c_00 < 0x10000) * 2) | 0xfffffffffffffffc) +
                             (long)pUVar12);
          uVar8 = (ushort)c;
          if (bVar2) {
            if (c - 0x10000 < 0x100000) {
              *puVar13 = (short)(uVar5 >> 0xb) + 0xd7c0;
              puVar13[1] = uVar8 & 0x3ff | 0xdc00;
              bVar2 = true;
            }
            else {
              *puVar13 = uVar8;
              for (pUVar11 = (UChar *)(puVar13 + 2); pUVar11 < pUVar10; pUVar11 = pUVar11 + 1) {
                pUVar11[-1] = *pUVar11;
              }
              bVar2 = false;
              pUVar10 = pUVar10 + -1;
            }
          }
          else if (c - 0x10000 < 0x100000) {
            pUVar11 = pUVar10 + 1;
            for (; puVar13 + 1 < pUVar10; pUVar10 = pUVar10 + -1) {
              *pUVar10 = pUVar10[-1];
            }
            puVar13[1] = uVar8 & 0x3ff | 0xdc00;
            *puVar13 = (short)(uVar5 >> 0xb) + 0xd7c0;
            bVar2 = true;
            pUVar10 = pUVar11;
          }
          else {
            *puVar13 = uVar8;
            bVar2 = false;
          }
          pUVar11 = pUVar10;
          if (pUVar10 < pUVar12) {
            for (; pUVar6 = pUVar10, pUVar9 = pUVar11, pUVar12 < pUVar15; pUVar12 = pUVar12 + 1) {
              *pUVar11 = *pUVar12;
              pUVar11 = pUVar11 + 1;
            }
          }
          if (pUVar6 == pUVar9) goto LAB_0028eab1;
          list = (uint16_t *)0x0;
          pUVar15 = pUVar9;
          uVar8 = uVar14 & 0xff;
          if ((uVar5 & 1) != 0) {
            uVar3 = getRawNorm16(this,c);
            list = (uint16_t *)
                   ((long)this->extraData +
                   (ulong)(*(ushort *)((long)this->extraData + (ulong)(uVar3 & 0xfffe)) & 0x1f) * 2
                   + (ulong)(uVar3 & 0xfffe) + 2);
            uVar8 = uVar14 & 0xff;
          }
          goto LAB_0028e749;
        }
      }
      if (pUVar12 == pUVar15) {
LAB_0028eab1:
        ReorderingBuffer::setReorderingLimit(buffer,pUVar9);
        return;
      }
      if ((byte)uVar8 != 0) {
        if (onlyContiguous != '\0') {
          list = (uint16_t *)0x0;
        }
        goto LAB_0028e749;
      }
      puVar7 = getCompositionsListForDecompYes(this,norm16);
      list = (uint16_t *)0x0;
    } while (puVar7 == (uint16_t *)0x0);
    bVar2 = c_00 >= 0x10000;
    puVar13 = (ushort *)(((ulong)((uint)(c_00 < 0x10000) * 2) | 0xfffffffffffffffc) + (long)pUVar12)
    ;
  } while( true );
}

Assistant:

void Normalizer2Impl::recompose(ReorderingBuffer &buffer, int32_t recomposeStartIndex,
                                UBool onlyContiguous) const {
    UChar *p=buffer.getStart()+recomposeStartIndex;
    UChar *limit=buffer.getLimit();
    if(p==limit) {
        return;
    }

    UChar *starter, *pRemove, *q, *r;
    const uint16_t *compositionsList;
    UChar32 c, compositeAndFwd;
    uint16_t norm16;
    uint8_t cc, prevCC;
    UBool starterIsSupplementary;

    // Some of the following variables are not used until we have a forward-combining starter
    // and are only initialized now to avoid compiler warnings.
    compositionsList=NULL;  // used as indicator for whether we have a forward-combining starter
    starter=NULL;
    starterIsSupplementary=FALSE;
    prevCC=0;

    for(;;) {
        UCPTRIE_FAST_U16_NEXT(normTrie, UCPTRIE_16, p, limit, c, norm16);
        cc=getCCFromYesOrMaybe(norm16);
        if( // this character combines backward and
            isMaybe(norm16) &&
            // we have seen a starter that combines forward and
            compositionsList!=NULL &&
            // the backward-combining character is not blocked
            (prevCC<cc || prevCC==0)
        ) {
            if(isJamoVT(norm16)) {
                // c is a Jamo V/T, see if we can compose it with the previous character.
                if(c<Hangul::JAMO_T_BASE) {
                    // c is a Jamo Vowel, compose with previous Jamo L and following Jamo T.
                    UChar prev=(UChar)(*starter-Hangul::JAMO_L_BASE);
                    if(prev<Hangul::JAMO_L_COUNT) {
                        pRemove=p-1;
                        UChar syllable=(UChar)
                            (Hangul::HANGUL_BASE+
                             (prev*Hangul::JAMO_V_COUNT+(c-Hangul::JAMO_V_BASE))*
                             Hangul::JAMO_T_COUNT);
                        UChar t;
                        if(p!=limit && (t=(UChar)(*p-Hangul::JAMO_T_BASE))<Hangul::JAMO_T_COUNT) {
                            ++p;
                            syllable+=t;  // The next character was a Jamo T.
                        }
                        *starter=syllable;
                        // remove the Jamo V/T
                        q=pRemove;
                        r=p;
                        while(r<limit) {
                            *q++=*r++;
                        }
                        limit=q;
                        p=pRemove;
                    }
                }
                /*
                 * No "else" for Jamo T:
                 * Since the input is in NFD, there are no Hangul LV syllables that
                 * a Jamo T could combine with.
                 * All Jamo Ts are combined above when handling Jamo Vs.
                 */
                if(p==limit) {
                    break;
                }
                compositionsList=NULL;
                continue;
            } else if((compositeAndFwd=combine(compositionsList, c))>=0) {
                // The starter and the combining mark (c) do combine.
                UChar32 composite=compositeAndFwd>>1;

                // Replace the starter with the composite, remove the combining mark.
                pRemove=p-U16_LENGTH(c);  // pRemove & p: start & limit of the combining mark
                if(starterIsSupplementary) {
                    if(U_IS_SUPPLEMENTARY(composite)) {
                        // both are supplementary
                        starter[0]=U16_LEAD(composite);
                        starter[1]=U16_TRAIL(composite);
                    } else {
                        *starter=(UChar)composite;
                        // The composite is shorter than the starter,
                        // move the intermediate characters forward one.
                        starterIsSupplementary=FALSE;
                        q=starter+1;
                        r=q+1;
                        while(r<pRemove) {
                            *q++=*r++;
                        }
                        --pRemove;
                    }
                } else if(U_IS_SUPPLEMENTARY(composite)) {
                    // The composite is longer than the starter,
                    // move the intermediate characters back one.
                    starterIsSupplementary=TRUE;
                    ++starter;  // temporarily increment for the loop boundary
                    q=pRemove;
                    r=++pRemove;
                    while(starter<q) {
                        *--r=*--q;
                    }
                    *starter=U16_TRAIL(composite);
                    *--starter=U16_LEAD(composite);  // undo the temporary increment
                } else {
                    // both are on the BMP
                    *starter=(UChar)composite;
                }

                /* remove the combining mark by moving the following text over it */
                if(pRemove<p) {
                    q=pRemove;
                    r=p;
                    while(r<limit) {
                        *q++=*r++;
                    }
                    limit=q;
                    p=pRemove;
                }
                // Keep prevCC because we removed the combining mark.

                if(p==limit) {
                    break;
                }
                // Is the composite a starter that combines forward?
                if(compositeAndFwd&1) {
                    compositionsList=
                        getCompositionsListForComposite(getRawNorm16(composite));
                } else {
                    compositionsList=NULL;
                }

                // We combined; continue with looking for compositions.
                continue;
            }
        }

        // no combination this time
        prevCC=cc;
        if(p==limit) {
            break;
        }

        // If c did not combine, then check if it is a starter.
        if(cc==0) {
            // Found a new starter.
            if((compositionsList=getCompositionsListForDecompYes(norm16))!=NULL) {
                // It may combine with something, prepare for it.
                if(U_IS_BMP(c)) {
                    starterIsSupplementary=FALSE;
                    starter=p-1;
                } else {
                    starterIsSupplementary=TRUE;
                    starter=p-2;
                }
            }
        } else if(onlyContiguous) {
            // FCC: no discontiguous compositions; any intervening character blocks.
            compositionsList=NULL;
        }
    }
    buffer.setReorderingLimit(limit);
}